

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

void __thiscall Dependency::fixFileThatDependsOnMe(Dependency *this,string *file_to_fix)

{
  pointer pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string local_70;
  string local_50;
  
  getOriginalPath_abi_cxx11_(&local_70,this);
  getInnerPath_abi_cxx11_(&local_50,this);
  changeInstallName(file_to_fix,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  uVar3 = (ulong)((long)(this->symlinks).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->symlinks).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar2 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 * 0x20 != uVar2; uVar2 = uVar2 + 0x20) {
    pbVar1 = (this->symlinks).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    getInnerPath_abi_cxx11_(&local_70,this);
    changeInstallName(file_to_fix,(string *)((long)&(pbVar1->_M_dataplus)._M_p + uVar2),&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (missing_prefixes != false) {
    getInnerPath_abi_cxx11_(&local_70,this);
    changeInstallName(file_to_fix,&this->filename,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    uVar3 = (ulong)((long)(this->symlinks).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->symlinks).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5;
    uVar2 = 0;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 * 0x20 != uVar2; uVar2 = uVar2 + 0x20) {
      pbVar1 = (this->symlinks).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      getInnerPath_abi_cxx11_(&local_70,this);
      changeInstallName(file_to_fix,(string *)((long)&(pbVar1->_M_dataplus)._M_p + uVar2),&local_70)
      ;
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void Dependency::fixFileThatDependsOnMe(const std::string& file_to_fix)
{
    // for main lib file
    changeInstallName(file_to_fix, getOriginalPath(), getInnerPath());
    // for symlinks
    const int symamount = symlinks.size();
    for(int n=0; n<symamount; n++)
    {
        changeInstallName(file_to_fix, symlinks[n], getInnerPath());
    }
    
    // FIXME - hackish
    if(missing_prefixes)
    {
        // for main lib file
        changeInstallName(file_to_fix, filename, getInnerPath());
        // for symlinks
        const int symamount = symlinks.size();
        for(int n=0; n<symamount; n++)
        {
            changeInstallName(file_to_fix, symlinks[n], getInnerPath());
        }
    }
}